

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O2

int __thiscall Conn::do_recv(Conn *this,ConnInfo *conn_info)

{
  char **ppcVar1;
  FILE *__stream;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  size_t __nbytes;
  int iVar5;
  uint uVar6;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 uVar7;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  ppcVar1 = &(conn_info->buf)._r_pos;
  pcVar4 = (conn_info->buf)._r_pos;
  __nbytes = (long)ppcVar1 - (long)pcVar4;
  if (__nbytes == 0) {
    fprintf(_stderr,"%s(%d)-<%s>: sock_fd: %d can read, but buf have no space to read!\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
            ,0x7e,"do_recv",(ulong)(uint)conn_info->fd);
    fflush(_stderr);
    iVar5 = -3;
  }
  else {
    sVar2 = read(conn_info->fd,pcVar4,__nbytes);
    uVar6 = (uint)sVar2;
    if ((int)uVar6 < 0) {
      piVar3 = __errno_location();
      __stream = _stderr;
      iVar5 = 0;
      if (*piVar3 != 0xb) {
        uVar6 = conn_info->fd;
        pcVar4 = strerror(*piVar3);
        fprintf(__stream,"%s(%d)-<%s>: recv fd %d occurs error, error %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
                ,0x87,"do_recv",(ulong)uVar6,pcVar4);
        fflush(_stderr);
        exit(-2);
      }
    }
    else if (uVar6 == 0) {
      fprintf(_stderr,"%s(%d)-<%s>: recv fd %d, close by client\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0x8d,"do_recv",(ulong)(uint)conn_info->fd);
      fflush(_stderr);
      conn_info->readeof = true;
      iVar5 = -1;
    }
    else {
      iVar5 = 0;
      fprintf(_stderr,"%s(%d)-<%s>: read done from fd: %d, total nbytes: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0x93,"do_recv",(ulong)(uint)conn_info->fd,CONCAT44(uVar7,uVar6));
      fflush(_stderr);
      *ppcVar1 = *ppcVar1 + (uVar6 & 0x7fffffff);
    }
  }
  return iVar5;
}

Assistant:

int Conn::do_recv(ConnInfo *conn_info)
{
    Buff &buf = conn_info->buf;
    // LOG_PRINT("conn_info->buf: %p, conn_info->buf.left_size(): %lu", buf._buf, buf.left_size());
    if (buf.left_size() == 0)
    {
        LOG_PRINT("sock_fd: %d can read, but buf have no space to read!", conn_info->fd);
        return err_svr_recv_nospace;
    }

    int nrecv = read(conn_info->fd, buf._r_pos, buf.left_size());
    if (nrecv < 0)
    {
        if (errno != EAGAIN)    //也就是 EWOULDBLOCK
        {
            LOG_PRINT("recv fd %d occurs error, error %s", conn_info->fd, strerror(errno));
            exit(err_svr_recv_error);
        }
    }
    else if (nrecv == 0)
    {
        LOG_PRINT("recv fd %d, close by client", conn_info->fd);
        conn_info->readeof = true;
        return err_svr_recv_eof;
    }
    else
    {
        LOG_PRINT("read done from fd: %d, total nbytes: %d", conn_info->fd, nrecv);
        buf.set_r_pow(nrecv);
        return err_svr_recv_normal;
    }

    return err_svr_recv_normal;
}